

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_match_prefix(char *pattern,int pattern_len,char *str)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  __int32_t **pp_Var8;
  long lVar10;
  uint uVar11;
  size_t sVar12;
  size_t sVar9;
  
  while( true ) {
    pvVar7 = memchr(pattern,0x7c,(long)pattern_len);
    if (pvVar7 == (void *)0x0) break;
    iVar5 = (int)pattern;
    iVar3 = mg_match_prefix(pattern,(int)pvVar7 - iVar5,str);
    if (0 < iVar3) {
      return iVar3;
    }
    pattern = (char *)((long)pvVar7 + 1);
    pattern_len = (iVar5 + pattern_len) - (int)pattern;
  }
  if (pattern_len < 1) {
    return 0;
  }
  sVar12 = 0;
  do {
    bVar2 = pattern[sVar12];
    uVar11 = (uint)sVar12;
    if (bVar2 == 0x3f) {
      if (str[sVar12] == '\0') {
        if ((ulong)bVar2 == 0x2a) goto LAB_0010f0f8;
        goto LAB_0010f0c1;
      }
    }
    else {
      if (bVar2 == 0x24) {
        return -(uint)(str[sVar12] != '\0') | uVar11;
      }
      if (bVar2 == 0x2a) {
LAB_0010f0f8:
        if (pattern[sVar12 + 1] == '*') {
          iVar3 = uVar11 + 2;
          sVar9 = strlen(str + sVar12);
          uVar4 = (uint)sVar9;
        }
        else {
          iVar3 = uVar11 + 1;
          sVar9 = strcspn(str + sVar12,"/");
          uVar4 = (uint)sVar9;
        }
        if (pattern_len - iVar3 == 0) {
          return uVar4 + uVar11;
        }
        iVar5 = ((int)uVar4 >> 0x1f & uVar4) - 1;
        lVar10 = 0;
        break;
      }
LAB_0010f0c1:
      pp_Var8 = __ctype_tolower_loc();
      if ((*pp_Var8)[bVar2] != (*pp_Var8)[(byte)str[sVar12]]) {
        return -1;
      }
    }
    sVar12 = sVar12 + 1;
    if ((long)pattern_len == sVar12) {
      return pattern_len;
    }
  } while( true );
  while (lVar1 = (long)(int)uVar4 + 1 + lVar10, lVar10 = lVar10 + -1, lVar1 != 1 && -1 < lVar1 + -1)
  {
    iVar6 = mg_match_prefix(pattern + iVar3,pattern_len - iVar3,
                            str + lVar10 + (long)(int)uVar4 + sVar12);
    if (iVar6 != -1) {
      iVar5 = uVar4 + (int)lVar10;
      break;
    }
  }
  iVar3 = uVar11 + iVar5 + iVar6;
  if (iVar6 == -1) {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int mg_match_prefix(const char *pattern, int pattern_len, const char *str) {
    const char *or_str;
    int len, res, i = 0, j = 0;

    if ((or_str = (const char *) memchr(pattern, '|', pattern_len)) != NULL) {
        res = mg_match_prefix(pattern, or_str - pattern, str);
        return res > 0 ? res : mg_match_prefix(
                or_str + 1,
                (pattern + pattern_len) - (or_str + 1), str);
    }

    for (; i < pattern_len; i++, j++) {
        if (pattern[i] == '?' && str[j] != '\0') {
            continue;
        } else if (pattern[i] == '$') {
            return str[j] == '\0' ? j : -1;
        } else if (pattern[i] == '*') {
            i++;
            if (pattern[i] == '*') {
                i++;
                len = (int) strlen(str + j);
            } else {
                len = (int) strcspn(str + j, "/");
            }
            if (i == pattern_len) {
                return j + len;
            }
            do {
                res = mg_match_prefix(pattern + i, pattern_len - i, str + j + len);
            } while (res == -1 && len-- > 0);
            return res == -1 ? -1 : j + res + len;
        } else if (lowercase(&pattern[i]) != lowercase(&str[j])) {
            return -1;
        }
    }
    return j;
}